

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O3

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial
          (longdouble *__return_storage_ptr__,TPZGaussRule *this,longdouble x,int order,
          longdouble alpha,longdouble beta,TPZVec<long_double> *b,TPZVec<long_double> *c,
          longdouble *dp2,longdouble *p1)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble *plVar3;
  longdouble *in_RAX;
  undefined4 in_register_00000014;
  long lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  
  *dp2 = (longdouble)1;
  *(longdouble *)c = (longdouble)1;
  if (1 < (int)this) {
    in_RAX = *(longdouble **)(CONCAT44(in_register_00000014,order) + 8);
    plVar3 = b->fStore;
    lVar5 = (longdouble)0;
    lVar4 = 0;
    lVar7 = (alpha - beta) / (alpha + beta + (longdouble)2.0) + x;
    do {
      lVar1 = *dp2;
      *dp2 = lVar7;
      lVar6 = x - *(longdouble *)((long)in_RAX + lVar4 + 0x10);
      lVar2 = *(longdouble *)((long)plVar3 + lVar4 + 0x10);
      lVar8 = lVar2 * lVar5;
      lVar5 = *(longdouble *)c;
      *(longdouble *)c = (lVar6 * lVar5 + lVar7) - lVar8;
      lVar4 = lVar4 + 0x10;
      lVar7 = lVar6 * lVar7 - lVar1 * lVar2;
    } while (((ulong)this & 0xffffffff) * 0x10 + -0x10 != lVar4);
  }
  return in_RAX;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x, int order,long double alpha, long double beta, 
							TPZVec<long double> &b, TPZVec<long double> &c,long double *dp2, long double *p1 )
{
	long double p2, p0, dp0, dp1;
	int i;
	
	*p1 = 1.0L;
	dp1 = 0.0L;	
	p2 = x + (alpha - beta)/(alpha + beta + 2.0L);
	*dp2 = 1.0L;
	
	for(i=2;i<=order;i++) {
		p0 = *p1;
		dp0 = dp1;
		
		*p1 = p2;
		dp1 = *dp2;
		
		p2 = (x - b[i-1])*(*p1) - c[i-1]*p0;
		*dp2 = (x - b[i-1])*dp1 + (*p1) - c[i-1]*dp0;
	}
	return p2;
}